

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnGlobal(SharedValidator *this,Location *loc,Type type,bool mutable_)

{
  GlobalType local_2c;
  undefined1 local_21;
  Location *pLStack_20;
  bool mutable__local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  
  local_21 = mutable_;
  pLStack_20 = loc;
  loc_local = (Location *)this;
  this_local._0_4_ = type.enum_;
  GlobalType::GlobalType(&local_2c,type,mutable_);
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::push_back(&this->globals_,&local_2c);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnGlobal(const Location& loc,
                                 Type type,
                                 bool mutable_) {
  globals_.push_back(GlobalType{type, mutable_});
  return Result::Ok;
}